

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::detail::arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::detail::error_handler>::
write_char(arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::detail::error_handler> *this,
          char_type value)

{
  buffer<char> *pbVar1;
  format_specs *pfVar2;
  size_t sVar3;
  long lVar4;
  char *pcVar5;
  buffer<char> *c;
  undefined4 uVar6;
  undefined7 in_register_00000031;
  ulong uVar7;
  ulong n;
  ulong uVar8;
  char *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  char cVar9;
  
  pbVar1 = (this->out_).container;
  pfVar2 = this->specs_;
  if (pfVar2 == (format_specs *)0x0) {
    sVar3 = pbVar1->size_;
    uVar7 = sVar3 + 1;
    if (pbVar1->capacity_ < uVar7) {
      (**pbVar1->_vptr_buffer)(pbVar1,uVar7);
    }
    pbVar1->size_ = uVar7;
    pbVar1->ptr_[sVar3] = value;
  }
  else {
    uVar6 = (undefined4)CONCAT71(in_register_00000031,value);
    lVar4 = (long)pfVar2->width;
    if (lVar4 < 0) {
      assert_fail((char *)CONCAT44(uVar6,in_stack_ffffffffffffffc0),0,in_stack_ffffffffffffffb8);
    }
    uVar7 = 0;
    if (lVar4 != 0) {
      uVar7 = lVar4 - 1;
    }
    n = uVar7 >> (*(byte *)((long)&basic_data<void>::left_padding_shifts +
                           (ulong)((byte)pfVar2->field_0x9 & 0xf)) & 0x3f);
    sVar3 = pbVar1->size_;
    uVar8 = (pfVar2->fill).size_ * uVar7 + sVar3 + 1;
    if (pbVar1->capacity_ < uVar8) {
      (**pbVar1->_vptr_buffer)(pbVar1,uVar8);
    }
    cVar9 = (char)uVar6;
    pbVar1->size_ = uVar8;
    pcVar5 = fill<char*,char>(pbVar1->ptr_ + sVar3,n,&pfVar2->fill);
    *pcVar5 = cVar9;
    fill<char*,char>(pcVar5 + 1,uVar7 - n,&pfVar2->fill);
    (this->out_).container = pbVar1;
  }
  return;
}

Assistant:

void write_char(char_type value) {
    if (specs_)
      out_ = write_padded(out_, *specs_, 1, char_writer{value});
    else
      write(value);
  }